

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<signed_char,char_const(&)[2],unsigned_char,char_const(&)[2],signed_char,char_const(&)[2],kj::CappedArray<char,3ul>>
          (String *__return_storage_ptr__,kj *this,char *params,char (*params_1) [2],uchar *params_2
          ,char (*params_3) [2],char *params_4,char (*params_5) [2],CappedArray<char,_3UL> *params_6
          )

{
  char *pcVar1;
  char (*pacVar2) [2];
  uchar *value;
  CappedArray<char,_3UL> *value_00;
  CappedArray<char,_5UL> CVar3;
  String *params_6_00;
  ArrayPtr<const_char> local_d8;
  CappedArray<char,_5UL> local_c8;
  CappedArray<char,_5UL> local_b8;
  ArrayPtr<const_char> local_a8;
  CappedArray<char,_5UL> local_98;
  CappedArray<char,_5UL> local_88;
  undefined1 local_78 [16];
  CappedArray<char,_5UL> local_68;
  CappedArray<char,_5UL> local_58;
  undefined5 local_48;
  undefined3 local_43;
  char acStack_40 [5];
  char (*local_38) [2];
  char *params_local_4;
  char (*params_local_3) [2];
  uchar *params_local_2;
  char (*params_local_1) [2];
  char *params_local;
  
  params_6_00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (char *)params_2;
  params_local_3 = params_1;
  params_local_2 = (uchar *)params;
  params_local_1 = (char (*) [2])this;
  params_local = (char *)__return_storage_ptr__;
  pcVar1 = fwd<signed_char>((NoInfer<signed_char> *)this);
  local_58 = toCharSequence<signed_char>(pcVar1);
  acStack_40 = local_58.content;
  local_48 = (undefined5)local_58.currentSize;
  local_43 = local_58.currentSize._5_3_;
  pacVar2 = ::const((char (*) [2])params_local_2);
  local_68 = (CappedArray<char,_5UL>)toCharSequence<char_const(&)[2]>(pacVar2);
  value = fwd<unsigned_char>((NoInfer<unsigned_char> *)params_local_3);
  local_88 = toCharSequence<unsigned_char>(value);
  local_78._8_5_ = local_88.content;
  local_78._0_5_ = (undefined5)local_88.currentSize;
  local_78._5_3_ = local_88.currentSize._5_3_;
  pacVar2 = ::const((char (*) [2])params_local_4);
  local_98 = (CappedArray<char,_5UL>)toCharSequence<char_const(&)[2]>(pacVar2);
  pcVar1 = fwd<signed_char>(*local_38);
  CVar3 = toCharSequence<signed_char>(pcVar1);
  local_b8.currentSize = CVar3.currentSize;
  local_a8.ptr = (char *)local_b8.currentSize;
  local_b8.content._0_4_ = CVar3.content._0_4_;
  local_a8.size_._0_1_ = local_b8.content[0];
  local_a8.size_._1_1_ = local_b8.content[1];
  local_a8.size_._2_1_ = local_b8.content[2];
  local_a8.size_._3_1_ = local_b8.content[3];
  local_b8.content[4] = CVar3.content[4];
  local_a8.size_._4_1_ = local_b8.content[4];
  local_b8 = CVar3;
  pacVar2 = ::const((char (*) [2])params_4);
  local_c8 = (CappedArray<char,_5UL>)toCharSequence<char_const(&)[2]>(pacVar2);
  value_00 = fwd<kj::CappedArray<char,3ul>>((NoInfer<kj::CappedArray<char,_3UL>_> *)params_5);
  local_d8 = toCharSequence<kj::CappedArray<char,3ul>>(value_00);
  _::
  concat<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_6_00,(_ *)&local_48,&local_68,(ArrayPtr<const_char> *)local_78,&local_98,
             &local_a8,&local_c8,&local_d8,(ArrayPtr<const_char> *)params_6_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}